

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O2

string * __thiscall wasm::IString::toString_abi_cxx11_(string *__return_storage_ptr__,IString *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (this->str)._M_str;
  sVar2 = (this->str)._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const { return {str.data(), str.size()}; }